

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict
new_proto(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,int vararg_p,
         __va_list_tag *argp)

{
  long lVar1;
  size_t sVar2;
  MIR_item_t_conflict pMVar3;
  size_t asStack_90 [3];
  undefined8 *local_78;
  __va_list_tag *local_70;
  uint local_64;
  undefined4 *local_60;
  __va_list_tag *local_58;
  uint local_4c;
  ulong local_48;
  size_t i;
  MIR_var_t *args;
  size_t sStack_30;
  int vararg_p_local;
  size_t nargs_local;
  MIR_type_t *res_types_local;
  size_t nres_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  name_local = (char *)ctx;
  nres_local = (size_t)name;
  res_types_local = (MIR_type_t *)nres;
  nargs_local = (size_t)res_types;
  sStack_30 = nargs;
  args._4_4_ = vararg_p;
  lVar1 = -(nargs * 0x18 + 0xf & 0xfffffffffffffff0);
  sVar2 = (long)&local_78 + lVar1;
  i = sVar2;
  for (local_48 = 0; local_48 < nargs; local_48 = local_48 + 1) {
    local_58 = argp;
    local_4c = argp->gp_offset;
    if (local_4c < 0x29) {
      argp->gp_offset = local_4c + 8;
      local_60 = (undefined4 *)((long)(int)local_4c + (long)argp->reg_save_area);
    }
    else {
      local_60 = (undefined4 *)argp->overflow_arg_area;
      argp->overflow_arg_area = local_60 + 2;
    }
    *(undefined4 *)(sVar2 + local_48 * 0x18) = *local_60;
    local_70 = argp;
    local_64 = argp->gp_offset;
    if (local_64 < 0x29) {
      argp->gp_offset = local_64 + 8;
      local_78 = (undefined8 *)((long)(int)local_64 + (long)argp->reg_save_area);
    }
    else {
      local_78 = (undefined8 *)argp->overflow_arg_area;
      argp->overflow_arg_area = local_78 + 1;
    }
    *(undefined8 *)(sVar2 + local_48 * 0x18 + 8) = *local_78;
  }
  *(size_t *)((long)asStack_90 + lVar1 + 8) = sVar2;
  *(undefined8 *)((long)asStack_90 + lVar1) = 0x112084;
  pMVar3 = new_proto_arr(ctx,name,nres,res_types,nargs,vararg_p,
                         *(MIR_var_t **)((long)asStack_90 + lVar1 + 8));
  return pMVar3;
}

Assistant:

static MIR_item_t new_proto (MIR_context_t ctx, const char *name, size_t nres,
                             MIR_type_t *res_types, size_t nargs, int vararg_p, va_list argp) {
  MIR_var_t *args = alloca (nargs * sizeof (MIR_var_t));
  size_t i;

  for (i = 0; i < nargs; i++) {
    args[i].type = va_arg (argp, MIR_type_t);
    args[i].name = va_arg (argp, const char *);
  }
  return new_proto_arr (ctx, name, nres, res_types, nargs, vararg_p, args);
}